

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O2

void __thiscall CircBufTest::test1(CircBufTest *this,CircularBuffer *tbuff)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  void *__s1;
  int k;
  int iVar5;
  ulong uVar6;
  int i;
  uint uVar7;
  ulong uVar8;
  int size;
  int tmpsz;
  CircularBuffer hugeBuf;
  CircularBuffer tinyBuf;
  uint8_t buf [254];
  uint8_t dumpBuf [254];
  
  JetHead::CircularBuffer::CircularBuffer(&tinyBuf,1);
  JetHead::CircularBuffer::CircularBuffer(&hugeBuf,0xfe);
  if (tbuff != (CircularBuffer *)0x0) {
    memcpy(&hugeBuf,tbuff,0xd9);
  }
  for (lVar4 = 0; lVar4 != 0xfe; lVar4 = lVar4 + 1) {
    buf[lVar4] = (uint8_t)lVar4;
  }
  iVar1 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar1 != 1) && (iVar1 = JetHead::CircularBuffer::getSize(), iVar1 != 1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xbf,"getFreeSpace or getSize failure.");
  }
  iVar1 = JetHead::CircularBuffer::getLength();
  if (iVar1 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xc2,"getLength failure.");
  }
  JetHead::CircularBuffer::writeByte((uchar)&tinyBuf);
  iVar1 = JetHead::CircularBuffer::getLength();
  if (((iVar1 != 1) && (iVar1 = JetHead::CircularBuffer::getSize(), iVar1 != 1)) &&
     (iVar1 = JetHead::CircularBuffer::getFreeSpace(), iVar1 != 0)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,200,"update of buffer length after writeByte failed");
  }
  JetHead::CircularBuffer::clear();
  iVar1 = JetHead::CircularBuffer::getLength();
  if (((iVar1 != 0) && (iVar1 = JetHead::CircularBuffer::getSize(), iVar1 != 1)) &&
     (iVar1 = JetHead::CircularBuffer::getFreeSpace(), iVar1 != 1)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xce,"update of buffer length after clear failed");
  }
  JetHead::CircularBuffer::write((uchar *)&hugeBuf,(int)buf);
  iVar1 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar1 != 0x7f) && (iVar1 = JetHead::CircularBuffer::getLength(), iVar1 != 0x7f)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xd7,"update of buffer length after write failed");
  }
  JetHead::CircularBuffer::read((uchar *)&hugeBuf,(int)dumpBuf);
  iVar1 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar1 != 0xfe) && (iVar1 = JetHead::CircularBuffer::getLength(), iVar1 != 0)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xdf,"update of buffer length after read failed");
  }
  JetHead::CircularBuffer::write((uchar *)&hugeBuf,(int)buf);
  iVar1 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar1 != 0x7f) && (iVar1 = JetHead::CircularBuffer::getLength(), iVar1 != 0x7f)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xe9,"update of buffer length after write failed");
  }
  iVar1 = JetHead::CircularBuffer::byteAt((int)&hugeBuf);
  if (iVar1 != -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xef,"byteAt failed");
  }
  iVar5 = 1;
  JetHead::CircularBuffer::getBytes((int)&hugeBuf,(int *)0x0);
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
             ,0xf6,"getBytes failed");
  JetHead::CircularBuffer::clear();
  iVar1 = JetHead::CircularBuffer::getFreeSpace();
  if ((iVar1 != 0xfe) && (iVar1 = JetHead::CircularBuffer::getLength(), iVar1 != 0)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0xfe,"update of buffer length after clear failed");
  }
  for (; iVar5 != 0xfe; iVar5 = iVar5 + 1) {
    if ((char)(((ushort)iVar5 & 0xff) % 0x18) == '\0') {
      JetHead::CircularBuffer::clear();
      iVar1 = JetHead::CircularBuffer::getSize();
      if (((iVar1 != 0xfe) && (iVar1 = JetHead::CircularBuffer::getFreeSpace(), iVar1 != 0xfe)) &&
         (iVar1 = JetHead::CircularBuffer::getLength(), iVar1 != 0)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x114,"getLength, getSize, or getFreeSpace failed after a clear.");
      }
    }
    rand();
    JetHead::CircularBuffer::write((uchar *)&hugeBuf,(int)buf);
    JetHead::CircularBuffer::read((uchar *)&hugeBuf,(int)dumpBuf);
    for (uVar6 = 0; uVar6 != 0xfe; uVar6 = uVar6 + 1) {
      iVar1 = JetHead::CircularBuffer::getSize();
      if (((iVar1 != 0xfe) && (iVar1 = JetHead::CircularBuffer::getFreeSpace(), iVar1 != 0xfe)) &&
         (iVar1 = JetHead::CircularBuffer::getLength(), iVar1 != 0)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x124,"getLength, getSize, or getFreeSpace failure.");
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        JetHead::CircularBuffer::writeByte((uchar)&hugeBuf);
      }
      iVar1 = JetHead::CircularBuffer::getSize();
      if (((iVar1 != 0xfe) &&
          (iVar1 = JetHead::CircularBuffer::getFreeSpace(), 0xfe - (int)uVar6 != iVar1)) &&
         (uVar2 = JetHead::CircularBuffer::getLength(), uVar6 != uVar2)) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,300,"getLength, getSize, or getFreeSpace failure.");
      }
      uVar8 = uVar6 & 0xffffffff;
      while( true ) {
        iVar1 = (int)&hugeBuf;
        if ((int)uVar8 < 1) break;
        uVar7 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar7;
        uVar2 = JetHead::CircularBuffer::byteAt(iVar1);
        if (uVar7 != uVar2) {
          TestCase::TestFailedInternal
                    (&this->super_TestCase,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                     ,0x131,"writeByte or byteAt failed");
        }
      }
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        __s1 = (void *)JetHead::CircularBuffer::getBytes(iVar1,(int *)(uVar8 & 0xffffffff));
        iVar3 = bcmp(__s1,buf + uVar8,(long)size);
        if (iVar3 != 0) {
          TestCase::TestFailedInternal
                    (&this->super_TestCase,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                     ,0x138,"getBytes failed");
        }
      }
      JetHead::CircularBuffer::getLength();
      JetHead::CircularBuffer::read((uchar *)&hugeBuf,(int)dumpBuf);
    }
  }
  JetHead::CircularBuffer::~CircularBuffer(&hugeBuf);
  JetHead::CircularBuffer::~CircularBuffer(&tinyBuf);
  return;
}

Assistant:

void CircBufTest::test1(CircularBuffer* tbuff)
{
	CircularBuffer tinyBuf = CircularBuffer(1);
	// uint8_t tmpbuf[HUGE_BUF_SIZE];
	//CircularBuffer hugeBuf = CircularBuffer(tmpbuf,HUGE_BUF_SIZE);
	CircularBuffer hugeBuf = CircularBuffer(HUGE_BUF_SIZE);


	if(tbuff != NULL)
		hugeBuf = *tbuff;

	uint8_t buf[HUGE_BUF_SIZE];
	uint8_t dumpBuf[HUGE_BUF_SIZE];

	iota(buf, buf + HUGE_BUF_SIZE , (uint8_t) 0);


	// Checking getFreeSpace, getSize, getLength on a buffer of size 1.
	if (tinyBuf.getFreeSpace() != 1 && tinyBuf.getSize() != 1)
		TestFailed("getFreeSpace or getSize failure.");

	if (tinyBuf.getLength() != 0)
		TestFailed("getLength failure.");

	tinyBuf.writeByte(0);

	// Test that after writing a byte free space and length are updated correctly
	if (tinyBuf.getLength() != 1 && tinyBuf.getSize() != 1 && tinyBuf.getFreeSpace() != 0)
		TestFailed("update of buffer length after writeByte failed");

	tinyBuf.clear();

	// Test that after calling claer free space and length are updated correctly
	if (tinyBuf.getLength() != 0 &&  tinyBuf.getSize() != 1 && tinyBuf.getFreeSpace() != 1)
		TestFailed("update of buffer length after clear failed");


	// Test individual write
	hugeBuf.write(buf, HUGE_BUF_SIZE / 2);
	
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE / 2
		and hugeBuf.getLength() != HUGE_BUF_SIZE / 2)
	{
		TestFailed("update of buffer length after write failed");
	}
	
	// Test that a read can undo the write
	hugeBuf.read(dumpBuf, HUGE_BUF_SIZE);
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE
		and hugeBuf.getLength() != 0)
	{
		TestFailed("update of buffer length after read failed");
	}
	
	
	// Test individual write again
	hugeBuf.write(buf, HUGE_BUF_SIZE / 2);
	
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE / 2
		and hugeBuf.getLength() != HUGE_BUF_SIZE / 2)
	{
		TestFailed("update of buffer length after write failed");
	}
	
	int tmp = hugeBuf.byteAt(HUGE_BUF_SIZE / 2);
	if (tmp != -1)
	{
		TestFailed("byteAt failed");
	}
	
	int tmpsz = HUGE_BUF_SIZE;
	const uint8_t *tmpptr = hugeBuf.getBytes(0, tmpsz);
	if (tmpsz != HUGE_BUF_SIZE / 2)
	{
		TestFailed("getBytes failed");
	}
	tmpptr = NULL;
	
	hugeBuf.clear();
	if (hugeBuf.getFreeSpace() != HUGE_BUF_SIZE
		and hugeBuf.getLength() != 0)
	{
		TestFailed("update of buffer length after clear failed");
	}
	
	// More testing of getSize, getFreeSpace, getLength, but with a large buffer.
	// Also testing byte interface.

	// This code is semi-randomized, it initally fills a bit of the buffer and
	// empties it, with the goal to get the buffer out of its initial state.

	// Then in each iteration it adds some amount
	// (starting small and becoming large) of bytes to the buffer,
	//  and takes them out.
	for (int j = 1; j < HUGE_BUF_SIZE; j++)
	{
		// Warning: If clear could screw up something below, but I doubt it.
		if( j % 24 == 0)
		{
			hugeBuf.clear();

			if( hugeBuf.getSize() != HUGE_BUF_SIZE &&
					hugeBuf.getFreeSpace() != HUGE_BUF_SIZE &&
					hugeBuf.getLength() != 0)
				TestFailed("getLength, getSize, or getFreeSpace failed after a clear.");
		}
		int offset = rand() % j;

		// Just want to advance starting position.
		hugeBuf.write(buf, offset );
		hugeBuf.read(dumpBuf, offset);



		for( int k = 0; k < HUGE_BUF_SIZE; k++)
		{

			if( hugeBuf.getSize() != HUGE_BUF_SIZE &&
					hugeBuf.getFreeSpace() != HUGE_BUF_SIZE &&
					hugeBuf.getLength() != 0)
				TestFailed("getLength, getSize, or getFreeSpace failure.");

			for( int i = 0; i < k; i++)
				hugeBuf.writeByte((uint8_t)i);

			if( hugeBuf.getSize() != HUGE_BUF_SIZE &&
					hugeBuf.getFreeSpace() != HUGE_BUF_SIZE - k &&
					hugeBuf.getLength() != k)
				TestFailed("getLength, getSize, or getFreeSpace failure.");

			// Do it backwards for fun.
			for(int i = k - 1; i > -1; i--)
				if( hugeBuf.byteAt(i) != i)
					TestFailed("writeByte or byteAt failed");

			int size;
			for( int i = 0; i < k; i++)
			{
				const uint8_t *loc = hugeBuf.getBytes(i , size);
				if ( memcmp(loc, buf + i, size) )
					TestFailed("getBytes failed");
			}

			// byteAt doesn't take things out of the buffer, so do it manually.
			hugeBuf.read(dumpBuf,hugeBuf.getLength());
		}
	}
}